

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

string * __thiscall
cmGlobalNinjaGenerator::NinjaOutputPath
          (string *__return_storage_ptr__,cmGlobalNinjaGenerator *this,string *path)

{
  bool bVar1;
  cmAlphaNum local_78;
  cmAlphaNum local_48;
  
  if (((this->OutputPathPrefix)._M_string_length != 0) &&
     (bVar1 = cmsys::SystemTools::FileIsFullPath(path), !bVar1)) {
    local_48.View_._M_str = (this->OutputPathPrefix)._M_dataplus._M_p;
    local_48.View_._M_len = (this->OutputPathPrefix)._M_string_length;
    local_78.View_._M_str = (path->_M_dataplus)._M_p;
    local_78.View_._M_len = path->_M_string_length;
    cmStrCat<>(__return_storage_ptr__,&local_48,&local_78);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::NinjaOutputPath(
  std::string const& path) const
{
  if (!this->HasOutputPathPrefix() || cmSystemTools::FileIsFullPath(path)) {
    return path;
  }
  return cmStrCat(this->OutputPathPrefix, path);
}